

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lstm.cpp
# Opt level: O0

void __thiscall ncnn::LSTM::LSTM(LSTM *this)

{
  undefined8 *in_RDI;
  Layer *in_stack_ffffffffffffffd0;
  
  Layer::Layer(in_stack_ffffffffffffffd0);
  *in_RDI = &PTR__LSTM_001e0b20;
  Mat::Mat((Mat *)(in_RDI + 0x19));
  Mat::Mat((Mat *)(in_RDI + 0x21));
  Mat::Mat((Mat *)(in_RDI + 0x29));
  *(undefined1 *)(in_RDI + 1) = 1;
  *(undefined1 *)((long)in_RDI + 9) = 0;
  return;
}

Assistant:

LSTM::LSTM()
{
    one_blob_only = true;
    support_inplace = false;
}